

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall
c4::basic_substring<const_char>::ends_with_any(basic_substring<const_char> *this,ro_substr chars)

{
  char cVar1;
  bool bVar2;
  error_flags eVar3;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t i;
  ulong local_48;
  long local_38;
  ulong local_30;
  char *local_20;
  undefined4 local_18;
  ulong local_10;
  long *local_8;
  
  if (in_RDI[1] != 0) {
    local_38 = in_RSI;
    local_30 = in_RDX;
    for (local_48 = 0; local_48 < local_30; local_48 = local_48 + 1) {
      cVar1 = *(char *)(*in_RDI + in_RDI[1] + -1);
      local_8 = &local_38;
      local_10 = local_48;
      if (local_30 <= local_48) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        local_20 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_18 = 0x14c3;
        handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (cVar1 == *(char *)(local_38 + local_10)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ends_with_any(ro_substr chars) const
    {
        if(len == 0)
        {
            return false;
        }
        for(size_t i = 0; i < chars.len; ++i)
        {
            if(str[len - 1] == chars[i])
            {
                return true;
            }
        }
        return false;
    }